

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O2

int __thiscall particleSamples::read_in_particle_samples_SMASH_gzipped(particleSamples *this)

{
  vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
  *this_00;
  int iVar1;
  istream *piVar2;
  int iVar3;
  particleSamples *this_01;
  long lVar4;
  int pdg_id;
  int n_particle;
  int charge;
  int pdg_mother2;
  int pdg_mother1;
  int parent_proc_type;
  string temp_string;
  particle_info temp_particle_info;
  stringstream temp1;
  stringstream temp2;
  
  this_01 = (particleSamples *)this->full_particle_list;
  clear_out_previous_record
            (this,(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)this_01);
  temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
  temp_string._M_string_length = 0;
  temp_string.field_2._M_local_buf[0] = '\0';
  lVar4 = 0;
  iVar3 = 0;
  while (iVar3 < this->event_buffer_size) {
    gz_readline_abi_cxx11_((string *)&temp1,this_01,this->inputfile_gz);
    std::__cxx11::string::operator=((string *)&temp_string,(string *)&temp1);
    std::__cxx11::string::~string((string *)&temp1);
    iVar1 = gzeof(this->inputfile_gz);
    if (iVar1 != 0) break;
    this_00 = (vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
               *)this->full_particle_list;
    _temp1 = (pointer)operator_new(0x18);
    _temp1[0] = '\0';
    _temp1[1] = '\0';
    _temp1[2] = '\0';
    _temp1[3] = '\0';
    _temp1[4] = '\0';
    _temp1[5] = '\0';
    _temp1[6] = '\0';
    _temp1[7] = '\0';
    _temp1[8] = '\0';
    _temp1[9] = '\0';
    _temp1[10] = '\0';
    _temp1[0xb] = '\0';
    _temp1[0xc] = '\0';
    _temp1[0xd] = '\0';
    _temp1[0xe] = '\0';
    _temp1[0xf] = '\0';
    _temp1[0x10] = '\0';
    _temp1[0x11] = '\0';
    _temp1[0x12] = '\0';
    _temp1[0x13] = '\0';
    _temp1[0x14] = '\0';
    _temp1[0x15] = '\0';
    _temp1[0x16] = '\0';
    _temp1[0x17] = '\0';
    std::
    vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
    ::emplace_back<std::vector<particle_info,std::allocator<particle_info>>*>
              (this_00,(vector<particle_info,_std::allocator<particle_info>_> **)&temp1);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&temp1,(string *)&temp_string,_S_out|_S_in);
    this_01 = (particleSamples *)&n_particle;
    std::istream::operator>>((istream *)&temp1,(int *)this_01);
    for (iVar1 = 0; iVar1 < n_particle; iVar1 = iVar1 + 1) {
      gz_readline_abi_cxx11_((string *)&temp2,this_01,this->inputfile_gz);
      std::__cxx11::string::operator=((string *)&temp_string,(string *)&temp2);
      std::__cxx11::string::~string((string *)&temp2);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&temp2,(string *)&temp_string,_S_out|_S_in);
      piVar2 = (istream *)std::istream::operator>>((istream *)&temp2,&pdg_id);
      piVar2 = (istream *)std::istream::operator>>(piVar2,&charge);
      piVar2 = (istream *)std::istream::operator>>(piVar2,&parent_proc_type);
      piVar2 = (istream *)std::istream::operator>>(piVar2,&pdg_mother1);
      std::istream::operator>>(piVar2,&pdg_mother2);
      piVar2 = std::istream::_M_extract<double>((double *)&temp2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      piVar2 = std::istream::_M_extract<double>((double *)piVar2);
      std::istream::_M_extract<double>((double *)piVar2);
      temp_particle_info.monval = pdg_id;
      this_01 = (particleSamples *)&temp_particle_info;
      std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                ((this->full_particle_list->
                 super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar4],(value_type *)this_01);
      std::__cxx11::stringstream::~stringstream((stringstream *)&temp2);
    }
    iVar3 = iVar3 + n_particle;
    lVar4 = lVar4 + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&temp1);
  }
  std::__cxx11::string::~string((string *)&temp_string);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_SMASH_gzipped() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list);

    std::string temp_string;
    int n_particle;
    int parent_proc_type;
    int pdg_mother1, pdg_mother2;
    int pdg_id, charge;
    int ievent = 0;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_gz);

        if (gzeof(inputfile_gz)) break;

        full_particle_list->push_back(new vector<particle_info>);

        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;

        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_gz);
            std::stringstream temp2(temp_string);
            temp2 >> pdg_id >> charge >> parent_proc_type >> pdg_mother1
                >> pdg_mother2;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;
            temp_particle_info.monval = pdg_id;
            (*full_particle_list)[ievent]->push_back(temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}